

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

bool __thiscall
perfetto::protos::gen::FtraceConfig::operator==(FtraceConfig *this,FtraceConfig *other)

{
  __type_conflict4 _Var1;
  bool bVar2;
  
  _Var1 = ::std::operator==(&this->unknown_fields_,&other->unknown_fields_);
  if ((((((_Var1) &&
         (bVar2 = ::std::operator==(&this->ftrace_events_,&other->ftrace_events_), bVar2)) &&
        (bVar2 = ::std::operator==(&this->atrace_categories_,&other->atrace_categories_), bVar2)) &&
       ((bVar2 = ::std::operator==(&this->atrace_apps_,&other->atrace_apps_), bVar2 &&
        (this->buffer_size_kb_ == other->buffer_size_kb_)))) &&
      ((this->drain_period_ms_ == other->drain_period_ms_ &&
       ((bVar2 = protozero::operator==(&this->compact_sched_,&other->compact_sched_), bVar2 &&
        (this->symbolize_ksyms_ == other->symbolize_ksyms_)))))) &&
     ((this->initialize_ksyms_synchronously_for_testing_ ==
       other->initialize_ksyms_synchronously_for_testing_ &&
      (this->throttle_rss_stat_ == other->throttle_rss_stat_)))) {
    return this->disable_generic_events_ == other->disable_generic_events_;
  }
  return false;
}

Assistant:

bool FtraceConfig::operator==(const FtraceConfig& other) const {
  return unknown_fields_ == other.unknown_fields_
   && ftrace_events_ == other.ftrace_events_
   && atrace_categories_ == other.atrace_categories_
   && atrace_apps_ == other.atrace_apps_
   && buffer_size_kb_ == other.buffer_size_kb_
   && drain_period_ms_ == other.drain_period_ms_
   && compact_sched_ == other.compact_sched_
   && symbolize_ksyms_ == other.symbolize_ksyms_
   && initialize_ksyms_synchronously_for_testing_ == other.initialize_ksyms_synchronously_for_testing_
   && throttle_rss_stat_ == other.throttle_rss_stat_
   && disable_generic_events_ == other.disable_generic_events_;
}